

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFunctionLibrary.cpp
# Opt level: O2

void __thiscall
tcu::StaticFunctionLibrary::StaticFunctionLibrary
          (StaticFunctionLibrary *this,Entry *entries,int numEntries)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  deFunctionPtr *__y;
  bool bVar3;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>
  local_58;
  
  (this->super_FunctionLibrary)._vptr_FunctionLibrary =
       (_func_int **)&PTR__StaticFunctionLibrary_0072ee20;
  p_Var1 = &(this->m_functions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_functions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar2 = 0;
  if (0 < numEntries) {
    uVar2 = (ulong)(uint)numEntries;
  }
  __y = &entries->ptr;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,((Entry *)(__y + -1))->name,&local_79);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)()>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_58,&local_78,__y);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)()>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)()>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,void(*)()>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)()>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)()>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)()>>>
                *)&this->m_functions,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    __y = __y + 2;
  }
  return;
}

Assistant:

StaticFunctionLibrary::StaticFunctionLibrary (const Entry* entries, int numEntries)
{
	for (int entryNdx = 0; entryNdx < numEntries; entryNdx++)
		m_functions.insert(std::make_pair(std::string(entries[entryNdx].name), entries[entryNdx].ptr));
}